

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall
sf::RenderTarget::draw
          (RenderTarget *this,VertexBuffer *vertexBuffer,size_t firstVertex,size_t vertexCount,
          RenderStates *states)

{
  bool bVar1;
  uint uVar2;
  PrimitiveType PVar3;
  ostream *poVar4;
  RenderTarget *pRVar5;
  size_t sVar6;
  RenderTarget *this_00;
  unsigned_long *puVar7;
  ulong uVar8;
  socklen_t __len;
  socklen_t __len_00;
  RenderTarget *in_RDX;
  VertexBuffer *in_RSI;
  sockaddr *psVar9;
  long *in_RDI;
  Uint64 in_R8;
  char *in_stack_00000100;
  uint in_stack_0000010c;
  char *in_stack_00000110;
  RenderStates *in_stack_ffffffffffffffb8;
  RenderTarget *this_01;
  undefined1 useVertexCache;
  
  bVar1 = VertexBuffer::isAvailable();
  if (bVar1) {
    this_01 = in_RDX;
    pRVar5 = (RenderTarget *)VertexBuffer::getVertexCount(in_RSI);
    if (this_01 <= pRVar5) {
      sVar6 = VertexBuffer::getVertexCount(in_RSI);
      this_00 = (RenderTarget *)(sVar6 - (long)in_RDX);
      puVar7 = std::min<unsigned_long>
                         ((unsigned_long *)&stack0xffffffffffffffe0,
                          (unsigned_long *)&stack0xffffffffffffffd0);
      pRVar5 = (RenderTarget *)*puVar7;
      if ((pRVar5 != (RenderTarget *)0x0) &&
         (uVar2 = VertexBuffer::getNativeHandle(in_RSI), uVar2 != 0)) {
        bVar1 = anon_unknown.dwarf_73f79::isActive(in_R8);
        useVertexCache = (undefined1)(in_R8 >> 0x38);
        if ((bVar1) || (uVar8 = (**(code **)(*in_RDI + 0x18))(), (uVar8 & 1) != 0)) {
          psVar9 = (sockaddr *)0x0;
          setupDraw(pRVar5,(bool)useVertexCache,(RenderStates *)this_00);
          VertexBuffer::bind((int)in_RSI,psVar9,__len);
          if (((*(byte *)(in_RDI + 0x2b) & 1) == 0) || ((*(byte *)(in_RDI + 0x30) & 1) == 0)) {
            glEnableClientState(0x8078);
            priv::glCheckError(in_stack_00000110,in_stack_0000010c,in_stack_00000100);
          }
          glVertexPointer(2,0x1406,0x14,0);
          priv::glCheckError(in_stack_00000110,in_stack_0000010c,in_stack_00000100);
          glColorPointer(4,0x1401,0x14,8);
          priv::glCheckError(in_stack_00000110,in_stack_0000010c,in_stack_00000100);
          glTexCoordPointer(2,0x1406,0x14,0xc);
          priv::glCheckError(in_stack_00000110,in_stack_0000010c,in_stack_00000100);
          PVar3 = VertexBuffer::getPrimitiveType(in_RSI);
          psVar9 = (sockaddr *)(ulong)PVar3;
          drawPrimitives(this_00,(PrimitiveType)((ulong)in_RDI >> 0x20),(size_t)this_01,
                         (size_t)in_stack_ffffffffffffffb8);
          VertexBuffer::bind(0,psVar9,__len_00);
          cleanupDraw(this_01,in_stack_ffffffffffffffb8);
          *(undefined1 *)((long)in_RDI + 0x181) = 0;
          *(undefined1 *)(in_RDI + 0x30) = 1;
        }
      }
    }
  }
  else {
    poVar4 = err();
    poVar4 = std::operator<<(poVar4,"sf::VertexBuffer is not available, drawing skipped");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void RenderTarget::draw(const VertexBuffer& vertexBuffer, std::size_t firstVertex,
                        std::size_t vertexCount, const RenderStates& states)
{
    // VertexBuffer not supported?
    if (!VertexBuffer::isAvailable())
    {
        err() << "sf::VertexBuffer is not available, drawing skipped" << std::endl;
        return;
    }

    // Sanity check
    if (firstVertex > vertexBuffer.getVertexCount())
        return;

    // Clamp vertexCount to something that makes sense
    vertexCount = std::min(vertexCount, vertexBuffer.getVertexCount() - firstVertex);

    // Nothing to draw?
    if (!vertexCount || !vertexBuffer.getNativeHandle())
        return;

    // GL_QUADS is unavailable on OpenGL ES
    #ifdef SFML_OPENGL_ES
        if (vertexBuffer.getPrimitiveType() == Quads)
        {
            err() << "sf::Quads primitive type is not supported on OpenGL ES platforms, drawing skipped" << std::endl;
            return;
        }
    #endif

    if (isActive(m_id) || setActive(true))
    {
        setupDraw(false, states);

        // Bind vertex buffer
        VertexBuffer::bind(&vertexBuffer);

        // Always enable texture coordinates
        if (!m_cache.enable || !m_cache.texCoordsArrayEnabled)
            glCheck(glEnableClientState(GL_TEXTURE_COORD_ARRAY));

        glCheck(glVertexPointer(2, GL_FLOAT, sizeof(Vertex), reinterpret_cast<const void*>(0)));
        glCheck(glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(Vertex), reinterpret_cast<const void*>(8)));
        glCheck(glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), reinterpret_cast<const void*>(12)));

        drawPrimitives(vertexBuffer.getPrimitiveType(), firstVertex, vertexCount);

        // Unbind vertex buffer
        VertexBuffer::bind(NULL);

        cleanupDraw(states);

        // Update the cache
        m_cache.useVertexCache = false;
        m_cache.texCoordsArrayEnabled = true;
    }
}